

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *__s;
  size_type sVar2;
  long *__nptr;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  allocator local_91;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  long *local_30;
  
  sVar2 = FILE_NAME_abi_cxx11_._M_string_length;
  if (argc < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please Input the dataset path:",0x1e);
    std::operator>>((istream *)&std::cin,(string *)&FILE_NAME_abi_cxx11_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please Input the length of record in dtaset:",0x2c);
    std::istream::operator>>((istream *)&std::cin,&record_length);
LAB_00107306:
    printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
    printf("\x1b[0m\x1b[1;32m|         Application: Find Super Spreader         |\n\x1b[0m");
    printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
    printf("\x1b[0m\x1b[1;32m|                     F1 SCORE                     |\n\x1b[0m");
    printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,FILE_NAME_abi_cxx11_._M_dataplus._M_p,
               FILE_NAME_abi_cxx11_._M_dataplus._M_p + FILE_NAME_abi_cxx11_._M_string_length);
    SuperSpread_Test_Hitter<4u>(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
    printf("\x1b[0m\x1b[1;32m|                    THROUGHPUT                    |\n\x1b[0m");
    printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,FILE_NAME_abi_cxx11_._M_dataplus._M_p,
               FILE_NAME_abi_cxx11_._M_dataplus._M_p + FILE_NAME_abi_cxx11_._M_string_length);
    SuperSpread_Test_Speed<4u>(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    printf("\x1b[0m\x1b[1;32m====================================================\n\x1b[0m");
    return 0;
  }
  __s = argv[1];
  strlen(__s);
  std::__cxx11::string::_M_replace(0x113660,0,(char *)sVar2,(ulong)__s);
  std::__cxx11::string::string((string *)local_50,argv[2],&local_91);
  __nptr = local_50[0];
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  lVar5 = strtol((char *)__nptr,(char **)&local_30,10);
  if (local_30 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar3 = (int)lVar5;
    if ((iVar3 == lVar5) && (*piVar4 != 0x22)) {
      if (*piVar4 == 0) {
        *piVar4 = iVar1;
      }
      record_length = iVar3;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      goto LAB_00107306;
    }
  }
  uVar6 = std::__throw_out_of_range("stoi");
  _Unwind_Resume(uVar6);
}

Assistant:

int main(int argc, char* argv[]) {
  // ===================== Determine the threshold==================
  // cout << FILE_NAME << endl;

  // HashMap mp;
  // StreamMap sp;

  // FILE* file = fopen((FILE_NAME).c_str(),"rb");
  // Data from;
  // Data to;
  // uint num = 0;
  // while(num<interval)
  // {
  //     fread(from.str, DATA_LEN, 1, file);
  //     fread(&to.str, DATA_LEN, 1, file);

  //     Stream stream(from, to);
  //     if(sp.find(stream) == sp.end()){
  //         sp[stream] = 1;
  //         if(mp.find(from) == mp.end())
  //             mp[from] = 1;
  //         else
  //             mp[from] += 1;
  //     }
  //     num++;
  // }
  // printf("HIT=%d\n", Get_TopK(mp, 250));
  // ===============================================================
    if (argc > 2)
    {
        FILE_NAME = argv[1];
        record_length = std::stoi(argv[2]);
    }
    else
    {
        std::cout << "Please Input the dataset path:";
        std::cin >> FILE_NAME;
        std::cout << "Please Input the length of record in dtaset:";
        std::cin >> record_length;
    }
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  printf(
      "\033[0m\033[1;32m|         Application: Find Super Spreader         "
      "|\n\033[0m");
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  printf(
      "\033[0m\033[1;32m|                     F1 SCORE                     "
      "|\n\033[0m");
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  SuperSpread_Test_Hitter<4>(FILE_NAME);
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  printf(
      "\033[0m\033[1;32m|                    THROUGHPUT                    "
      "|\n\033[0m");
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
  SuperSpread_Test_Speed<4>(FILE_NAME);
  printf(
      "\033[0m\033[1;32m===================================================="
      "\n\033[0m");
}